

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v2mconv.cpp
# Opt level: O1

void ConvertV2M(uchar *inptr,int inlen,uchar **outptr,int *outlen)

{
  uchar uVar1;
  byte bVar2;
  int iVar3;
  uint8_t *puVar4;
  int iVar5;
  int iVar6;
  uchar *__s;
  uint uVar7;
  long lVar8;
  uchar *puVar9;
  uchar *puVar10;
  byte bVar11;
  size_t __n;
  byte *pbVar12;
  byte *pbVar13;
  int iVar14;
  ulong uVar15;
  V2PARAM *pVVar16;
  long lVar17;
  byte *pbVar18;
  int iVar19;
  int q;
  ssbase base;
  int local_abc;
  ssbase local_a90;
  
  iVar5 = CheckV2MVersion(inptr,inlen,&local_a90);
  puVar4 = local_a90.patchmap;
  if (iVar5 == 0) {
    iVar5 = inlen + 4;
    pbVar13 = (byte *)operator_new__((long)iVar5);
    *outptr = pbVar13;
    memset(pbVar13,0,(long)iVar5);
    *outlen = iVar5;
    local_a90.speechdata = inptr;
    local_a90.spsize = inlen;
  }
  else {
    if (iVar5 < 0) {
      *outptr = (uchar *)0x0;
      *outlen = 0;
      return;
    }
    lVar8 = (long)v2version;
    lVar17 = lVar8 - iVar5;
    iVar5 = *(int *)local_a90.patchmap;
    iVar19 = iVar5 + 3;
    if (-1 < iVar5) {
      iVar19 = iVar5;
    }
    iVar19 = iVar19 >> 2;
    iVar5 = v2vsizes[lVar8];
    iVar3 = v2vsizes[lVar17];
    iVar14 = iVar19 * (iVar5 - iVar3);
    iVar6 = ((inlen + v2gsizes[lVar8]) - v2gsizes[lVar17]) + iVar14 + 4;
    *outlen = iVar6;
    local_a90.maxp = iVar19;
    __s = (uchar *)operator_new__((long)iVar6);
    *outptr = __s;
    lVar8 = 0;
    memset(__s,0,(long)iVar6);
    __n = (size_t)local_a90.midisize;
    memcpy(__s,inptr,__n);
    puVar9 = __s + __n;
    puVar10 = puVar9 + 4;
    puVar9[0] = '\x17';
    puVar9[1] = '\0';
    puVar9[2] = '\0';
    puVar9[3] = '\0';
    puVar9[0x13] = '\x01';
    puVar9[0x14] = '\x02';
    puVar9[0x15] = 'Z';
    puVar9[0x16] = ' ';
    puVar9[0x17] = '\x14';
    puVar9[0x18] = '@';
    puVar9[0x19] = '@';
    puVar9[0x1a] = '\0';
    puVar10[0] = '@';
    puVar10[1] = '@';
    puVar10[2] = ' ';
    puVar10[3] = '\x7f';
    puVar10[4] = 'd';
    puVar10[5] = 'P';
    puVar10[6] = '@';
    puVar10[7] = '@';
    puVar9[0xc] = '\0';
    puVar9[0xd] = '\0';
    puVar9[0xe] = '@';
    puVar9[0xf] = '\0';
    puVar9[0x10] = '\x7f';
    puVar9[0x11] = '\0';
    puVar9[0x12] = '\0';
    puVar9[0x13] = '\x01';
    do {
      iVar6 = (int)lVar17;
      if (*(int *)((long)&v2gparms[0].version + lVar8) <= iVar6) {
        uVar1 = *local_a90.globals;
        local_a90.globals = local_a90.globals + 1;
        *puVar10 = uVar1;
      }
      puVar10 = puVar10 + 1;
      lVar8 = lVar8 + 0x30;
    } while (lVar8 != 0x450);
    *(int *)(__s + __n + 0x1b) = iVar14 + local_a90.patchsize;
    local_a90.newpatchmap = __s + __n + 0x1f;
    for (local_abc = 0; local_abc < iVar19; local_abc = local_abc + 1) {
      *(int *)(local_a90.newpatchmap + (long)local_abc * 4) =
           local_abc * (iVar5 - iVar3) + *(int *)((long)puVar4 + (long)local_abc * 4);
    }
    pbVar13 = local_a90.newpatchmap + (long)iVar19 * 4;
    if (0 < local_a90.maxp) {
      lVar8 = 0;
      do {
        pbVar18 = (byte *)((ulong)*(uint *)((long)puVar4 + lVar8 * 4) + (long)local_a90.patchmap);
        memcpy(pbVar13,"@@\x01",0x59);
        lVar17 = 0;
        pbVar13 = pbVar13 + 1;
        do {
          pbVar12 = pbVar13;
          if (*(int *)((long)&v2parms[0].version + lVar17) <= iVar6) {
            bVar2 = *pbVar18;
            pbVar18 = pbVar18 + 1;
            pbVar12[-1] = bVar2;
          }
          lVar17 = lVar17 + 0x30;
          pbVar13 = pbVar12 + 1;
        } while (lVar17 != 0x10b0);
        bVar2 = *pbVar18;
        *pbVar12 = bVar2;
        if (bVar2 != 0) {
          pbVar18 = pbVar18 + 1;
          uVar7 = 0;
          do {
            *pbVar13 = *pbVar18;
            pbVar13[1] = pbVar18[1];
            bVar11 = pbVar18[2];
            pbVar13[2] = bVar11;
            uVar15 = 0xffffffffffffffff;
            pVVar16 = v2parms;
            do {
              if (iVar6 < pVVar16->version) {
                bVar11 = bVar11 + 1;
                pbVar13[2] = bVar11;
              }
              uVar15 = uVar15 + 1;
              pVVar16 = pVVar16 + 1;
            } while (uVar15 < bVar11);
            pbVar13 = pbVar13 + 3;
            pbVar18 = pbVar18 + 3;
            uVar7 = uVar7 + 1;
          } while (uVar7 != bVar2);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < local_a90.maxp);
    }
    *(int *)pbVar13 = local_a90.spsize;
    pbVar13 = pbVar13 + 4;
  }
  memcpy(pbVar13,local_a90.speechdata,(long)local_a90.spsize);
  return;
}

Assistant:

void ConvertV2M(const unsigned char *inptr, const int inlen, unsigned char **outptr, int *outlen)
{
    int i, p;
    ssbase base;
    // check version
    int vdelta = CheckV2MVersion(inptr, inlen, base);
    if (!vdelta) // if same, simply clone
    {
        *outptr = new uint8_t[inlen + 4];
        memset(*outptr, 0, inlen + 4);
        *outlen = inlen + 4;
        memcpy(*outptr, inptr, inlen);
        return;
    }
    else if (vdelta < 0) // if invalid...
    {
        *outptr = 0;
        *outlen = 0;
        return;
    }
    vdelta = v2version - vdelta;

    // fake base.maxp
    int maxp2 = ((int*)base.patchmap)[0]/4;
    if (maxp2 != base.maxp)
    {
        printf2("warning: patch count inconsistency: we:%d, they:%d\n", base.maxp, maxp2);
        base.maxp = maxp2;
    }

    // calc new size
    int gdiff = v2gsizes[v2version] - v2gsizes[vdelta];
    int pdiff = v2vsizes[v2version] - v2vsizes[vdelta];
    int newsize = inlen + gdiff + base.maxp*pdiff;
    printf2("old size: %d, new size: %d\n", inlen, newsize);

    // init new v2m
    *outlen = newsize + 4;
    uint8_t *newptr = *outptr = new uint8_t[newsize + 4];
    memset(newptr, 0, newsize + 4);

    // copy midi data
    memcpy(newptr, inptr, base.midisize);

    // new globals length...
    newptr += base.midisize;
    *(uint32_t *)newptr = v2ngparms;
    printf2("glob size: old %d, new %d\n", base.globsize, *(uint32_t *)newptr);
    newptr += 4;

    // copy/remap globals
    memcpy(newptr, v2initglobs, v2ngparms);
    const uint8_t *oldgptr = base.globals;
    for (i = 0; i < v2ngparms; i++)
    {
        if (v2gparms[i].version <= vdelta)
            newptr[i] = *oldgptr++;
    }
    newptr += v2ngparms;

    // new patch data length
    *(int *)newptr = base.patchsize + base.maxp*pdiff;
    printf2("patch size: old %d, new %d\n", base.patchsize, *(int *)newptr);
    newptr += 4;

    base.newpatchmap = newptr;

    uint32_t *poffsets = (uint32_t *)base.patchmap;
    uint32_t *noffsets = (uint32_t *)newptr;
    //const int ros = v2vsizes[vdelta] - 255*3 - 1;

    //uint8_t *nptr2 = newptr;

    // copy patch table...
    // gcc 5.3 seems to vectorize the loop, but
    // the loop is not correct for base.maxp == 10 at least
    // adding volatile to the iterator breaks the auto-vec
    for (volatile int q = 0; q < base.maxp; q++)
    {
        noffsets[q] = poffsets[q] + (q * pdiff);
    }

    newptr += 4*base.maxp;

    // for each patch...
    for (p = 0; p < base.maxp; p++)
    {
        const uint8_t *src = base.patchmap + poffsets[p];

        //const uint8_t *dest_soll = nptr2 + noffsets[p];
        printf2("p%d ist:%08x soll:%08x\n", p, newptr, dest_soll);

        // fill patch with default values
        memcpy(newptr, v2initsnd, v2nparms);

        // copy/remap patch data
        for (i = 0; i < v2nparms; i++)
        {
            if (v2parms[i].version <= vdelta)
            {
                *newptr = *src++;
                /*
                if (vdelta < 2 && (i == 33 || i == 36 || i == 39 || i == 42)) // fix envelopes
                    *newptr=transEnv(*newptr); */
            }
            newptr++;
        }

        // copy mod number
        const int modnum = *newptr ++= *src++;
        //        printf2("patch %d: %d mods\n",p,modnum);

        // copy/remap modulations
        for (i = 0; i < modnum; i++)
        {
            newptr[0] = src[0];
            newptr[1] = src[1];
            newptr[2] = src[2];
            for (int k = 0; k <= newptr[2]; k++)
                if (v2parms[k].version > vdelta) newptr[2]++;
            newptr += 3;
            src += 3;
        }
    }

    // copy speech
    *(uint32_t*)newptr = base.spsize;
    newptr += 4;
    memcpy(newptr, base.speechdata, base.spsize);
    newptr += base.spsize;

    printf2("est size: %d, real size: %d\n", newsize, newptr - *outptr);
}